

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O2

ANNdist __thiscall
ANNRectangle::DistPointRectangle(ANNRectangle *this,ANNcoord p1,ANNcoord p2,ANNcoord p3,ANNcoord p4)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (this->bnds1[0] <= p1) {
    dVar3 = 0.0;
    if (this->bnds1[1] <= p1) {
      dVar3 = this->bnds1[1] - p1;
    }
  }
  else {
    dVar3 = this->bnds1[0] - p1;
  }
  if (this->bnds2[0] <= p2) {
    dVar4 = 0.0;
    if (this->bnds2[1] <= p2) {
      dVar4 = this->bnds2[1] - p2;
    }
  }
  else {
    dVar4 = this->bnds2[0] - p2;
  }
  if (this->bnds3[0] <= p3) {
    dVar2 = 0.0;
    if (this->bnds3[1] <= p3) {
      dVar2 = this->bnds3[1] - p3;
    }
  }
  else {
    dVar2 = this->bnds3[0] - p3;
  }
  if (this->bnds4[0] <= p4) {
    dVar1 = 0.0;
    if (this->bnds4[1] <= p4) {
      dVar1 = this->bnds4[1] - p4;
    }
  }
  else {
    dVar1 = this->bnds4[0] - p4;
  }
  return dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4;
}

Assistant:

ANNdist ANNRectangle::DistPointRectangle(ANNcoord p1, ANNcoord p2, ANNcoord p3,
                                         ANNcoord p4) {
    ANNdist dist = 0.0;
    ANNdist *d = new ANNdist[4];

    if (p1 < bnds1[LO])
        d[0] = bnds1[LO] - p1;
    else if (p1 < bnds1[HI])
        d[0] = 0.0;
    else
        d[0] = bnds1[HI] - p1;

    if (p2 < bnds2[LO])
        d[1] = bnds2[LO] - p2;
    else if (p2 < bnds2[HI])
        d[1] = 0.0;
    else
        d[1] = bnds2[HI] - p2;

    if (p3 < bnds3[LO])
        d[2] = bnds3[LO] - p3;
    else if (p3 < bnds3[HI])
        d[2] = 0.0;
    else
        d[2] = bnds3[HI] - p3;

    if (p4 < bnds4[LO])
        d[3] = bnds4[LO] - p4;
    else if (p4 < bnds4[HI])
        d[3] = 0.0;
    else
        d[3] = bnds4[HI] - p4;

    dist = ANN_POW(d[0]) + ANN_POW(d[1]) + ANN_POW(d[2]) + ANN_POW(d[3]);
    delete[] d;
    return dist;
}